

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableMultiplicationGeneralizationImpl.hpp
# Opt level: O1

Result Inferences::VariableMultiplicationGeneralizationImpl::applyRule
                 (Clause *cl,bool doOrderingCheck)

{
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  *pDVar1;
  int *piVar2;
  VariableRegion *pVVar3;
  AnyNumber<Kernel::MonomFactor> *pAVar4;
  SplitSet *pSVar5;
  undefined8 uVar6;
  bool bVar7;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>
  RVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  undefined4 uVar12;
  Clause *cl_00;
  Clause *extraout_RDX;
  Clause *extraout_RDX_00;
  Clause *extraout_RDX_01;
  Clause *extraout_RDX_02;
  Clause *extraout_RDX_03;
  Clause *extraout_RDX_04;
  Clause *extraout_RDX_05;
  Clause *extraout_RDX_06;
  Clause *cl_01;
  Clause *extraout_RDX_07;
  RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top> *f;
  uint uVar13;
  int iVar14;
  undefined7 in_register_00000031;
  ulong uVar15;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  *pDVar16;
  anon_class_16_2_d708292f f_00;
  anon_class_16_2_f84bbffd f_01;
  anon_class_16_2_f84bbffd f_02;
  anon_class_16_2_f84bbffd f_03;
  anon_class_16_2_fd512dd3 f_04;
  anon_class_16_2_f84bbffd f_05;
  anon_class_16_2_f84bbffd f_06;
  Result RVar17;
  EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize> eval;
  Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> varRegions;
  Option<Inferences::AnyNumber<Kernel::MonomFactor>_> var;
  _ElementType out;
  StlIter __begin2;
  IntMap<Kernel::Variable> varMap;
  IntUnionFind components;
  AnyNumber<Kernel::MonomFactor> varPower;
  Clause *local_378;
  Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> local_370;
  undefined4 local_350;
  int local_34c;
  undefined1 local_348 [8];
  AnyNumber<Kernel::MonomFactor> *pAStack_340;
  SplitSet *local_338;
  SplitSet *pSStack_330;
  undefined1 local_328 [32];
  int *piStack_308;
  char local_300;
  Literal *local_2f8;
  undefined8 uStack_2f0;
  OptionBase<Kernel::PolyNf::SubtermIter> local_2e8;
  undefined1 local_2b8 [24];
  int *piStack_2a0;
  int *piStack_298;
  bool local_290;
  Value local_288;
  OptionBase<Kernel::PolyNf::SubtermIter> local_278;
  undefined1 local_248 [12];
  Value aVStack_23c [3];
  OptionBase<Kernel::PolyNf::SubtermIter> local_200;
  bool local_1d8;
  Value local_1d4;
  IntMap<Kernel::Variable> local_1c8;
  undefined1 local_180 [40];
  int *piStack_158;
  bool local_150;
  Value local_148;
  OptionBase<Kernel::PolyNf::SubtermIter> local_138;
  OptionBase<Kernel::Variable> local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  ulong local_d8 [4];
  undefined1 local_b8 [16];
  AnyNumber<Kernel::MonomFactor> *local_a8;
  anon_class_8_1_54a39801_for__func aStack_a0;
  OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> local_98;
  OptionBase<Kernel::PolyNf::SubtermIter> local_70;
  
  local_350 = (undefined4)CONCAT71(in_register_00000031,doOrderingCheck);
  local_1c8._map._capacity = 0;
  local_1c8._map._noOfEntries = 0;
  local_1c8._map._entries = (Entry *)0x0;
  ::Lib::Map<Kernel::Variable,_unsigned_int,_Lib::StlHash>::expand(&local_1c8._map);
  local_1c8._stack._cursor = (Variable *)0x0;
  local_1c8._stack._end = (Variable *)0x0;
  local_1c8._stack._capacity = 0;
  local_1c8._stack._stack = (Variable *)0x0;
  Inferences::anon_class_1_0_00000001::operator()
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>_>
              *)local_2b8,(anon_class_1_0_00000001 *)cl,cl_00);
  uVar6 = local_278._elem._elem.init._stack._cursor;
  local_328._8_8_ = CONCAT71(local_2b8._9_7_,local_2b8[8]);
  local_328._16_8_ = CONCAT44(local_2b8._20_4_,local_2b8._16_4_);
  local_328._24_8_ = piStack_2a0;
  piStack_308 = piStack_298;
  local_300 = local_290;
  if (local_290 == true) {
    local_2f8 = local_288.init._iter._lit;
    uStack_2f0 = local_288._8_8_;
  }
  local_2e8._isSome = local_278._isSome;
  if (local_278._isSome == true) {
    local_2e8._elem._elem.init._stack._capacity = local_278._elem._elem.init._stack._capacity;
    local_278._elem._elem.init._stack._capacity = 0;
    local_2e8._elem._elem.init._stack._end = local_278._elem._elem.init._stack._end;
    local_278._elem._elem.init._stack._end = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    local_278._elem._elem.init._stack._cursor = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    local_2e8._elem._elem.init._stack._stack = local_278._elem._elem.init._stack._stack;
    local_2e8._elem._elem.init._stack._cursor = (BottomUpChildIter<Kernel::PolyNf> *)uVar6;
    local_278._elem._elem.init._stack._stack = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
  }
  uVar6 = local_2e8._elem._elem.init._stack._cursor;
  local_180._32_8_ = piStack_2a0;
  piStack_158 = piStack_298;
  local_150 = local_290;
  if (local_290 != false) {
    local_148.init._iter._lit = local_2f8;
    local_148._8_8_ = uStack_2f0;
  }
  local_138._isSome = local_278._isSome;
  if (local_278._isSome != false) {
    local_138._elem._elem.init._stack._capacity = local_2e8._elem._elem.init._stack._capacity;
    local_2e8._elem._elem.init._stack._capacity = 0;
    local_138._elem._elem.init._stack._end = local_2e8._elem._elem.init._stack._end;
    local_2e8._elem._elem.init._stack._end = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    local_2e8._elem._elem.init._stack._cursor = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    local_138._elem._elem.init._stack._stack = local_2e8._elem._elem.init._stack._stack;
    local_138._elem._elem.init._stack._cursor = (BottomUpChildIter<Kernel::PolyNf> *)uVar6;
    local_2e8._elem._elem.init._stack._stack = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
  }
  local_110._isSome = false;
  local_110._1_3_ = 0;
  local_110._elem._elem = (Value)0x0;
  ::Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::Literal*)#1},Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1},Kernel::PolyNf::SubtermIter>>,Inferences::$_8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1}>
  ::operator()((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>,Inferences::__8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_>
                *)local_b8,
               (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
                *)local_180);
  ::Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::Literal*)#1},Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1},Kernel::PolyNf::SubtermIter>>,Inferences::$_8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1}>
  ::operator()((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>,Inferences::__8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_>
                *)local_248,
               (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
                *)local_b8);
  ::Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_70);
  ::Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_138);
  ::Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_2e8);
  ::Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_278);
  bVar7 = ::Lib::
          FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>
          ::hasNext((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
                     *)local_248);
  if (bVar7) {
    ::Lib::
    FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>
    ::hasNext((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
               *)local_248);
    uVar15 = ((ulong)(uint)local_1d4.field2 << 0x20) + 1;
    while( true ) {
      local_1d8 = false;
      local_b8._0_4_ = (int)(uVar15 >> 0x20);
      ::Lib::Map<Kernel::Variable,unsigned_int,Lib::StlHash>::
      updateOrInit<Lib::Map<Kernel::Variable,unsigned_int,Lib::StlHash>::getOrInit<Inferences::VariableMultiplicationGeneralizationImpl::IntMap<Kernel::Variable>::insert(Kernel::Variable)::_lambda()_1_>(Kernel::Variable,Inferences::VariableMultiplicationGeneralizationImpl::IntMap<Kernel::Variable>::insert(Kernel::Variable)::_lambda()_1_)::_lambda(unsigned_int)_1_,Inferences::VariableMultiplicationGeneralizationImpl::IntMap<Kernel::Variable>::insert(Kernel::Variable)::_lambda()_1_>
                ((Map<Kernel::Variable,unsigned_int,Lib::StlHash> *)&local_1c8,uVar15 >> 0x20,
                 &local_1c8,local_b8);
      bVar7 = ::Lib::
              FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>
              ::hasNext((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
                         *)local_248);
      if (!bVar7) break;
      ::Lib::
      FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>
      ::hasNext((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
                 *)local_248);
      uVar15 = (ulong)(uint)local_1d4.field2 << 0x20;
    }
  }
  ::Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_200);
  iVar14 = (int)((ulong)((long)local_1c8._stack._cursor - (long)local_1c8._stack._stack) >> 2);
  local_378 = cl;
  if (iVar14 == 0) {
    uVar12 = 0;
  }
  else {
    ::Lib::IntUnionFind::IntUnionFind((IntUnionFind *)local_180,iVar14);
    local_370._capacity =
         (ulong)((long)local_1c8._stack._cursor - (long)local_1c8._stack._stack) >> 2 & 0xffffffff;
    if (local_370._capacity == 0) {
      local_370._stack = (VariableRegion *)0x0;
      cl_01 = extraout_RDX;
    }
    else {
      uVar15 = local_370._capacity * 0x24 + 0xf & 0x7ffffffff0;
      if (uVar15 == 0) {
        local_370._stack =
             (VariableRegion *)
             ::Lib::FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
        cl_01 = extraout_RDX_01;
      }
      else if (uVar15 < 0x11) {
        local_370._stack =
             (VariableRegion *)
             ::Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
        cl_01 = extraout_RDX_00;
      }
      else if (uVar15 < 0x19) {
        local_370._stack =
             (VariableRegion *)
             ::Lib::FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
        cl_01 = extraout_RDX_02;
      }
      else if (uVar15 < 0x21) {
        local_370._stack =
             (VariableRegion *)
             ::Lib::FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
        cl_01 = extraout_RDX_03;
      }
      else if (uVar15 < 0x31) {
        local_370._stack =
             (VariableRegion *)
             ::Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
        cl_01 = extraout_RDX_04;
      }
      else if (uVar15 < 0x41) {
        local_370._stack =
             (VariableRegion *)
             ::Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
        cl_01 = extraout_RDX_05;
      }
      else {
        local_370._stack = (VariableRegion *)::operator_new(uVar15,0x10);
        cl_01 = extraout_RDX_06;
      }
    }
    local_370._end = (VariableRegion *)((long)local_370._stack + local_370._capacity * 0x24);
    local_370._cursor = local_370._stack;
    if ((int)((ulong)((long)local_1c8._stack._cursor - (long)local_1c8._stack._stack) >> 2) != 0) {
      uVar13 = 0;
      do {
        uStack_100 = 0;
        local_f8 = 0;
        uStack_f0 = 0;
        local_e8 = 0;
        local_108 = 1;
        if (local_370._cursor == local_370._end) {
          ::Lib::Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion>::expand
                    (&local_370);
        }
        ::Lib::CoproductImpl::TrivialOperations::MoveCons::
        DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
        ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                       *)local_370._cursor,
                      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                       *)&local_108);
        local_370._cursor = (VariableRegion *)((long)local_370._cursor + 0x24);
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>::
        switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>>::~DefaultImpl()::_lambda(auto:1)_1_>
                  ((RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>
                    *)&local_108,(anon_class_8_1_8991fb9c)&local_108);
        uVar13 = uVar13 + 1;
        cl_01 = extraout_RDX_07;
      } while (uVar13 < (uint)((ulong)((long)local_1c8._stack._cursor -
                                      (long)local_1c8._stack._stack) >> 2));
    }
    Inferences::anon_class_1_0_00000001::operator()
              ((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
                *)local_b8,(anon_class_1_0_00000001 *)cl,cl_01);
    local_248._0_8_ =
         (IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
          *)local_b8;
    ::Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
    ::tryNext((Option<Kernel::AnyPoly> *)(local_248 + 8),
              (IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
               *)local_b8);
    while ((bool)local_248[8] != false) {
      local_2b8[8] = '\0';
      local_2b8._0_5_ =
           CONCAT41(CONCAT13(aVStack_23c[0].init.super_AnyPolySuper._inner.
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
                             .
                             super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                             ._content[3],aVStack_23c[0]._1_3_),aVStack_23c[0]._0_1_) & 0xffffffff03
      ;
      local_2b8._5_3_ = 0;
      local_2b8._9_7_ = (undefined7)CONCAT53(aVStack_23c[0]._12_5_,aVStack_23c[0]._9_3_);
      local_2b8[0x10] = (byte)((uint5)aVStack_23c[0]._12_5_ >> 0x20);
      local_2b8._17_3_ = 0;
      f_00.this = (Coproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                   *)local_2b8;
      f_00.f = (Preprocess *)local_328;
      local_328._0_8_ = (IntUnionFind *)local_180;
      local_328._8_8_ = &local_1c8;
      local_328._16_8_ = &local_370;
      ::Lib::CoproductImpl::
      RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>
      ::
      switchN<Lib::Coproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>::apply<Inferences::VariableMultiplicationGeneralizationImpl::Preprocess>(Inferences::VariableMultiplicationGeneralizationImpl::Preprocess)&::_lambda(auto:1)_1_>
                ((RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>
                  *)local_2b8,f_00);
      ::Lib::
      IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
      ::StlIter::operator++((StlIter *)local_248);
    }
    ::Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_70);
    local_338 = (SplitSet *)0x0;
    pSStack_330 = (SplitSet *)0x0;
    local_348 = (undefined1  [8])0x0;
    pAStack_340 = (AnyNumber<Kernel::MonomFactor> *)0x0;
    ::Lib::IntUnionFind::evalComponents((IntUnionFind *)local_180);
    piVar11 = piStack_158;
    if (piStack_158 != (int *)local_180._32_8_) {
      iVar14 = piStack_158[-1];
      piVar2 = piStack_158;
      do {
        piVar11 = piVar2 + -1;
        iVar9 = ::Lib::IntUnionFind::root((IntUnionFind *)local_180,iVar14);
        pVVar3 = local_370._stack;
        lVar10 = (long)iVar9;
        if (((byte)*(RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>
                     *)((long)local_370._stack + lVar10 * 0x24) & 1) == 0) {
          aStack_a0.a = (Clause *)((long)local_370._stack + lVar10 * 0x24 + 1);
          local_a8 = *(AnyNumber<Kernel::MonomFactor> **)
                      ((long)local_370._stack + lVar10 * 0x24 + 0x11);
          local_98._isSome = false;
          bVar7 = ::Lib::
                  FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>
                  ::hasNext((FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
                             *)local_b8);
          if (bVar7) {
            ::Lib::
            FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>
            ::hasNext((FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
                       *)local_b8);
            local_2b8[8] = '\0';
            local_2b8._9_7_ = 0;
            local_2b8._16_4_ = 0;
            local_2b8[0x14] = '\0';
            local_2b8[0x15] = '\0';
            local_2b8[0x16] = '\0';
            local_2b8[0x17] = '\0';
            piStack_2a0 = (int *)0x0;
            local_2b8._0_8_ = (ulong)(byte)local_98._elem._elem._0_1_ & 0xffffffffffffff03;
            f_01.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                          *)&local_98._elem;
            f_01.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                         *)local_2b8;
            ::Lib::CoproductImpl::
            RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
            ::
            switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>&&)::_lambda(auto:1)_1_>
                      ((RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                        *)local_2b8,f_01);
            aVStack_23c[0].init.super_AnyPolySuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
            ._content[3] = '\0';
            aVStack_23c[0]._5_4_ = 0;
            aVStack_23c[0]._9_3_ = 0;
            aVStack_23c[0]._12_5_ = 0;
            aVStack_23c[0]._17_3_ = 0;
            local_248._0_8_ =
                 (IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
                  *)0x0;
            local_248._8_4_ = 0;
            aVStack_23c[0]._0_4_ = 0;
            aVStack_23c[1]._0_4_ = 0;
            ::Lib::OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::operator=
                      (&local_98,
                       (OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> *)local_248);
            local_248._8_4_ = 0;
            aVStack_23c[0]._0_4_ = 0;
            aVStack_23c[0].init.super_AnyPolySuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
            ._content[3] = '\0';
            aVStack_23c[0]._5_4_ = 0;
            aVStack_23c[0]._9_3_ = 0;
            aVStack_23c[0]._12_5_ = 0;
            aVStack_23c[0]._17_3_ = 0;
            local_248._0_8_ = local_2b8._0_8_ & 3;
            f_02.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                          *)local_2b8;
            f_02.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                         *)local_248;
            ::Lib::CoproductImpl::
            RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
            ::
            switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>&&)::_lambda(auto:1)_1_>
                      ((RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                        *)local_248,f_02);
            ::Lib::OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::OptionBase
                      ((OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> *)local_328,
                       (AnyNumber<Kernel::MonomFactor> *)local_248);
          }
          else {
            local_328._16_8_ =
                 (Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> *)0x0;
            local_328._24_8_ = (int *)0x0;
            local_328._0_8_ = (IntUnionFind *)0x0;
            local_328._8_8_ = (IntMap<Kernel::Variable> *)0x0;
            piStack_308 = (int *)((ulong)piStack_308 & 0xffffffff00000000);
          }
          local_34c = iVar14;
          if (local_328[0] == true) {
            pDVar1 = *(DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       **)((long)pVVar3 + lVar10 * 0x24 + 0x11);
            for (pDVar16 = *(DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             **)((long)pVVar3 + lVar10 * 0x24 + 9); pDVar16 != pDVar1;
                pDVar16 = pDVar16 + 1) {
              local_a8 = (AnyNumber<Kernel::MonomFactor> *)0x0;
              aStack_a0.a = (Clause *)0x0;
              local_b8._8_8_ = 0;
              local_b8._0_8_ =
                   (ulong)*(byte *)&(pDVar16->
                                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                    ).
                                    super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                   & 0xffffffffffffff03;
              f_03.other = pDVar16;
              f_03.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           *)local_b8;
              ::Lib::CoproductImpl::
              RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
              ::
              switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>>const&)::_lambda(auto:1)_1_>
                        ((RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                          *)local_b8,f_03);
              if (((local_328[4] ^ (byte)local_b8[0]) & 3) == 0) {
                local_248._0_8_ = local_328 + 4;
                f_04.f = (anon_class_8_1_ba1d745d_conflict2 *)local_248;
                f_04.this = (Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                             *)local_b8;
                RVar8 = ::Lib::CoproductImpl::
                        RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                        ::
                        switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                                  ((RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                    *)local_b8,f_04);
                if (!RVar8) goto LAB_0049c57e;
              }
              else {
LAB_0049c57e:
                local_d8[1] = 0;
                local_d8[2] = 0;
                local_d8[3] = 0;
                local_d8[0] = local_b8._0_8_ & 3;
                f_05.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                              *)local_b8;
                f_05.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             *)local_d8;
                ::Lib::CoproductImpl::
                RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                ::
                switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>>const&)::_lambda(auto:1)_1_>
                          ((RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                            *)local_d8,f_05);
                if (local_338 == pSStack_330) {
                  ::Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::expand
                            ((Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)local_348);
                }
                local_338[1]._size = 0;
                *(undefined8 *)local_338[1]._items = 0;
                local_338->_size = 0;
                *(undefined8 *)local_338->_items = 0;
                *(byte *)&local_338->_size = (byte)local_d8[0]._0_1_ & 3;
                f_06.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                              *)local_d8;
                f_06.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                             *)local_338;
                ::Lib::CoproductImpl::
                RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                ::
                switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>&&)::_lambda(auto:1)_1_>
                          ((RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                            *)local_338,f_06);
                local_338 = local_338 + 2;
              }
            }
          }
        }
        if (piVar11 == (int *)local_180._32_8_) break;
        iVar14 = piVar2[-2];
        piVar2 = piVar11;
      } while( true );
    }
    pSVar5 = local_338;
    pAVar4 = pAStack_340;
    if ((long)local_338 - (long)pAStack_340 == 0) {
      uVar12 = 0;
    }
    else {
      uVar15 = (long)local_338 - (long)pAStack_340 >> 5;
      lVar10 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<Inferences::AnyNumber<Kernel::MonomFactor>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pAStack_340,local_338,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<Inferences::AnyNumber<Kernel::MonomFactor>*,__gnu_cxx::__ops::_Iter_less_iter>
                (pAVar4,pSVar5);
      eval.eval.toRem = (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)(ulong)(byte)local_350
      ;
      eval.eval._8_8_ = piVar11;
      RVar17 = generalizeBottomUp<Inferences::EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize>>
                         ((Inferences *)cl,(Clause *)local_348,eval);
      local_378 = RVar17.simplified;
      uVar12 = RVar17._8_4_;
    }
    f = (RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top> *)
        local_370._cursor;
    if (pAStack_340 != (AnyNumber<Kernel::MonomFactor> *)0x0) {
      uVar15 = (long)local_348 << 5;
      if (uVar15 == 0) {
        *(undefined8 *)
         &(pAStack_340->
          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          )._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          .
          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pAStack_340;
      }
      else if (uVar15 < 0x21) {
        *(undefined8 *)
         &(pAStack_340->
          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          )._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          .
          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pAStack_340;
      }
      else if (uVar15 < 0x31) {
        *(undefined8 *)
         &(pAStack_340->
          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          )._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          .
          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pAStack_340;
      }
      else if (uVar15 < 0x41) {
        *(undefined8 *)
         &(pAStack_340->
          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          )._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          .
          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pAStack_340;
      }
      else {
        operator_delete(pAStack_340,0x10);
        f = (RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top> *)
            local_370._cursor;
      }
    }
    while (f != (RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>
                 *)local_370._stack) {
      f = f + -0x24;
      ::Lib::CoproductImpl::
      RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>::
      switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>>::~DefaultImpl()::_lambda(auto:1)_1_>
                (f,(anon_class_8_1_8991fb9c)f);
    }
    if ((RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top> *)
        local_370._stack !=
        (RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top> *)0x0)
    {
      uVar15 = local_370._capacity * 0x24 + 0xf & 0xfffffffffffffff0;
      if (uVar15 == 0) {
        *(undefined8 *)local_370._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_370._stack;
      }
      else if (uVar15 < 0x11) {
        *(undefined8 *)local_370._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_370._stack;
      }
      else if (uVar15 < 0x19) {
        *(undefined8 *)local_370._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_370._stack;
      }
      else if (uVar15 < 0x21) {
        *(undefined8 *)local_370._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_370._stack;
      }
      else if (uVar15 < 0x31) {
        *(undefined8 *)local_370._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_370._stack;
      }
      else if (uVar15 < 0x41) {
        *(undefined8 *)local_370._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_370._stack;
      }
      else {
        operator_delete(local_370._stack,0x10);
      }
    }
    ::Lib::IntUnionFind::~IntUnionFind((IntUnionFind *)local_180);
  }
  if (local_1c8._stack._stack != (Variable *)0x0) {
    uVar15 = local_1c8._stack._capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar15 == 0) {
      *(undefined8 *)local_1c8._stack._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_1c8._stack._stack;
    }
    else if (uVar15 < 0x11) {
      *(undefined8 *)local_1c8._stack._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_1c8._stack._stack;
    }
    else if (uVar15 < 0x19) {
      *(undefined8 *)local_1c8._stack._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_1c8._stack._stack;
    }
    else if (uVar15 < 0x21) {
      *(undefined8 *)local_1c8._stack._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_1c8._stack._stack;
    }
    else if (uVar15 < 0x31) {
      *(undefined8 *)local_1c8._stack._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_1c8._stack._stack;
    }
    else if (uVar15 < 0x41) {
      *(undefined8 *)local_1c8._stack._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_1c8._stack._stack;
    }
    else {
      operator_delete(local_1c8._stack._stack,0x10);
    }
  }
  ::Lib::Map<Kernel::Variable,_unsigned_int,_Lib::StlHash>::clear(&local_1c8._map);
  RVar17._8_4_ = uVar12;
  RVar17.simplified = local_378;
  RVar17._12_4_ = 0;
  return RVar17;
}

Assistant:

SimplifyingGeneratingInference1::Result applyRule(Clause* cl, bool doOrderingCheck) 
{
  DEBUG("input clause: ", *cl);
  IntMap<Variable> varMap;

  /* initialization */
  for (auto var : iterVars(cl)) {
    varMap.insert(var);
  }
  if (varMap.size() == 0) {
    DEBUG("no variables. generalization not applicable");
    return SimplifyingGeneratingInference1::Result::nop(cl);
  }

  IntUnionFind components(varMap.size());
  Stack<VariableRegion> varRegions(varMap.size());;
  for (unsigned i = 0; i < varMap.size(); i++)  {
    varRegions.push(VariableRegion());
  }

  /* preprocessing. finds all products `X0 ⋅ X1 ⋅ ... ⋅ Xn` such that the rule is applicable */
  for (auto poly : iterPolynoms(cl)) {
    poly.apply(Preprocess {components, varMap, varRegions});
  }


  /* create a stack of all variables that shall be removed in the final step */

  Stack<AnyNumber<MonomFactor>> remove;

  components.evalComponents();
  for (auto comp : iterTraits(IntUnionFind::ComponentIterator(components))) {
    auto& maybeRegion = varRegions[components.root(comp.next())];
    if (maybeRegion.isInit()) {
      auto& region = maybeRegion.unwrap();

      /* one variable with power one needs to be kept, per varible region */
      auto var = iterTraits(region.iter())
        .map([](auto& x) { return x; })
        .filter([](auto& p) { return p.apply([](auto& t){ return t.tryVar(); }).isSome(); })
        .tryNext();

      if (var.isSome()) {
        for (auto varPower : region) {
          if (varPower != var.unwrap()) {
            remove.push(varPower);
          }
        }
      }
    }
  }

  /* apply the substitution `X0 ⋅ X1 ⋅ ... ⋅ Xn ==> X0`  */
  DEBUG("removing variables: ", remove)
  if (remove.isEmpty()) {
    return SimplifyingGeneratingInference1::Result::nop(cl);
  } else {
    std::sort(remove.begin(), remove.end());
    Generalize gen { remove, doOrderingCheck };
    return generalizeBottomUp(cl, EvaluateMonom<Generalize> {gen});
  }
}